

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_712d::StatePointer_SetStateOutOfBounds_Test::TestBody
          (StatePointer_SetStateOutOfBounds_Test *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *message;
  RE local_108;
  AssertHelper local_78 [4];
  type local_54;
  Foo foo;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  ReturnSentinel gtest_sentinel;
  DeathTest *gtest_dt;
  
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&stack0xffffffffffffffb0,
             &local_54,0);
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) goto LAB_001279f5;
  testing::internal::RE::RE(&local_108,"state value is out of bounds for this state_ptr");
  bVar2 = testing::internal::DeathTest::Create
                    ("p.set_state(1337)",&local_108,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
                     ,0x3f,&gtest_sentinel.test_);
  if (bVar2) {
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      testing::internal::scoped_ptr<testing::internal::DeathTest>::scoped_ptr
                ((scoped_ptr<testing::internal::DeathTest> *)&p,gtest_sentinel.test_);
      iVar3 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])();
      if (iVar3 == 0) {
        iVar3 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*(gtest_sentinel.test_)->_vptr_DeathTest[4])(gtest_sentinel.test_,(ulong)bVar2);
        if ((char)iVar3 != '\0') goto LAB_001279cf;
        bVar2 = true;
        bVar1 = false;
      }
      else {
        if (iVar3 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_dt_ptr,gtest_sentinel.test_);
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::set_state
                      ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                       &stack0xffffffffffffffb0,0x539);
          }
          (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_dt_ptr);
        }
LAB_001279cf:
        bVar2 = false;
        bVar1 = true;
      }
      testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr
                ((scoped_ptr<testing::internal::DeathTest> *)&p);
      if (!bVar1) goto LAB_001279e4;
    }
    bVar2 = false;
  }
  else {
    bVar2 = true;
  }
LAB_001279e4:
  testing::internal::RE::~RE(&local_108);
  if (!bVar2) {
    return;
  }
LAB_001279f5:
  testing::Message::Message((Message *)&local_108);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (local_78,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
             ,0x3f,message);
  testing::internal::AssertHelper::operator=(local_78,(Message *)&local_108);
  testing::internal::AssertHelper::~AssertHelper(local_78);
  testing::Message::~Message((Message *)&local_108);
  return;
}

Assistant:

TEST(StatePointer, SetStateOutOfBounds) {
	Foo foo;
	state_ptr<Foo> p{&foo, 0};
	ASSERT_DEATH(p.set_state(1337), "state value is out of bounds for this state_ptr");
}